

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O0

void testing::internal::InitGoogleMockImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  char **extraout_RDX;
  char **streamable;
  char **extraout_RDX_00;
  int local_88;
  int32_t local_84;
  int j;
  int32_t value_2;
  string value_1;
  bool local_4a;
  byte local_49;
  bool value;
  char *pcStack_48;
  bool found_gmock_flag;
  char *arg;
  string arg_string;
  int i;
  char **argv_local;
  int *argc_local;
  
  InitGoogleTest(argc,argv);
  if (0 < *argc) {
    streamable = extraout_RDX;
    for (arg_string.field_2._12_4_ = 1; arg_string.field_2._12_4_ != *argc;
        arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + 1) {
      StreamableToString<char*>
                ((string *)&arg,(internal *)(argv + (int)arg_string.field_2._12_4_),streamable);
      pcStack_48 = (char *)std::__cxx11::string::c_str();
      local_49 = 0;
      local_4a = (bool)(FLAGS_gmock_catch_leaked_mocks & 1);
      bVar1 = ParseGoogleMockFlag(pcStack_48,"catch_leaked_mocks",&local_4a);
      if (bVar1) {
        FLAGS_gmock_catch_leaked_mocks = local_4a & 1;
        local_49 = 1;
      }
      if ((local_49 & 1) == 0) {
        std::__cxx11::string::string((string *)&j,(string *)FLAGS_gmock_verbose_abi_cxx11_);
        bVar1 = ParseGoogleMockFlag<std::__cxx11::string>
                          (pcStack_48,"verbose",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)FLAGS_gmock_verbose_abi_cxx11_,(string *)&j);
          local_49 = 1;
        }
        std::__cxx11::string::~string((string *)&j);
      }
      if ((local_49 & 1) == 0) {
        local_84 = FLAGS_gmock_default_mock_behavior;
        bVar1 = ParseGoogleMockFlag(pcStack_48,"default_mock_behavior",&local_84);
        if (bVar1) {
          FLAGS_gmock_default_mock_behavior = local_84;
          local_49 = 1;
        }
      }
      if ((local_49 & 1) != 0) {
        for (local_88 = arg_string.field_2._12_4_; local_88 != *argc; local_88 = local_88 + 1) {
          argv[local_88] = argv[local_88 + 1];
        }
        *argc = *argc + -1;
        arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + -1;
      }
      std::__cxx11::string::~string((string *)&arg);
      streamable = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    bool found_gmock_flag = false;

#define GMOCK_INTERNAL_PARSE_FLAG(flag_name)            \
  if (!found_gmock_flag) {                              \
    auto value = GMOCK_FLAG_GET(flag_name);             \
    if (ParseGoogleMockFlag(arg, #flag_name, &value)) { \
      GMOCK_FLAG_SET(flag_name, value);                 \
      found_gmock_flag = true;                          \
    }                                                   \
  }

    GMOCK_INTERNAL_PARSE_FLAG(catch_leaked_mocks)
    GMOCK_INTERNAL_PARSE_FLAG(verbose)
    GMOCK_INTERNAL_PARSE_FLAG(default_mock_behavior)

    if (found_gmock_flag) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}